

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::SSARewriter::ProcessLoad(SSARewriter *this,Instruction *inst,BasicBlock *bb)

{
  bool bVar1;
  uint32_t uVar2;
  IRContext *pIVar3;
  TypeManager *this_00;
  Type *pTVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  PhiCandidate *this_01;
  PhiCandidate *defining_phi;
  Instruction *pIStack_58;
  uint32_t load_id;
  Instruction *reaching_def_inst;
  bool found_reaching_def;
  Type *pTStack_48;
  uint32_t val_id;
  Type *load_type;
  TypeManager *type_mgr;
  DefUseManager *def_use_mgr;
  BasicBlock *pBStack_28;
  uint32_t var_id;
  BasicBlock *bb_local;
  Instruction *inst_local;
  SSARewriter *this_local;
  
  def_use_mgr._4_4_ = 0;
  pBStack_28 = bb;
  bb_local = (BasicBlock *)inst;
  inst_local = (Instruction *)this;
  MemPass::GetPtr(this->pass_,inst,(uint32_t *)((long)&def_use_mgr + 4));
  pIVar3 = Pass::context(&this->pass_->super_Pass);
  type_mgr = (TypeManager *)IRContext::get_def_use_mgr(pIVar3);
  pIVar3 = Pass::context(&this->pass_->super_Pass);
  this_00 = IRContext::get_type_mgr(pIVar3);
  load_type = (Type *)this_00;
  uVar2 = opt::Instruction::type_id((Instruction *)bb_local);
  pTStack_48 = analysis::TypeManager::GetType(this_00,uVar2);
  reaching_def_inst._4_4_ = 0;
  reaching_def_inst._3_1_ = 0;
  do {
    while( true ) {
      if (((reaching_def_inst._3_1_ ^ 0xff) & 1) == 0) {
        defining_phi._4_4_ = opt::Instruction::result_id((Instruction *)bb_local);
        sVar5 = std::
                unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::count(&this->load_replacement_,(key_type *)((long)&defining_phi + 4));
        uVar2 = reaching_def_inst._4_4_;
        if (sVar5 == 0) {
          pmVar6 = std::
                   unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   ::operator[](&this->load_replacement_,(key_type *)((long)&defining_phi + 4));
          *pmVar6 = uVar2;
          this_01 = GetPhiCandidate(this,reaching_def_inst._4_4_);
          if (this_01 != (PhiCandidate *)0x0) {
            PhiCandidate::AddUser(this_01,defining_phi._4_4_);
          }
          return true;
        }
        __assert_fail("load_replacement_.count(load_id) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ssa_rewrite_pass.cpp"
                      ,0x192,
                      "bool spvtools::opt::SSARewriter::ProcessLoad(Instruction *, BasicBlock *)");
      }
      bVar1 = MemPass::IsTargetVar(this->pass_,def_use_mgr._4_4_);
      if (!bVar1) {
        return true;
      }
      reaching_def_inst._4_4_ = GetReachingDef(this,def_use_mgr._4_4_,pBStack_28);
      if (reaching_def_inst._4_4_ == 0) {
        return false;
      }
      pIStack_58 = analysis::DefUseManager::GetDef
                             ((DefUseManager *)type_mgr,reaching_def_inst._4_4_);
      pTVar4 = load_type;
      if (pIStack_58 != (Instruction *)0x0) break;
LAB_0083dbdb:
      reaching_def_inst._3_1_ = 1;
    }
    uVar2 = opt::Instruction::type_id(pIStack_58);
    pTVar4 = analysis::TypeManager::GetType((TypeManager *)pTVar4,uVar2);
    bVar1 = analysis::Type::IsSame(pTVar4,pTStack_48);
    if (bVar1) goto LAB_0083dbdb;
    def_use_mgr._4_4_ = reaching_def_inst._4_4_;
  } while( true );
}

Assistant:

bool SSARewriter::ProcessLoad(Instruction* inst, BasicBlock* bb) {
  // Get the pointer that we are using to load from.
  uint32_t var_id = 0;
  (void)pass_->GetPtr(inst, &var_id);

  // Get the immediate reaching definition for |var_id|.
  //
  // In the presence of variable pointers, the reaching definition may be
  // another pointer.  For example, the following fragment:
  //
  //  %2 = OpVariable %_ptr_Input_float Input
  // %11 = OpVariable %_ptr_Function__ptr_Input_float Function
  //       OpStore %11 %2
  // %12 = OpLoad %_ptr_Input_float %11
  // %13 = OpLoad %float %12
  //
  // corresponds to the pseudo-code:
  //
  // layout(location = 0) in flat float *%2
  // float %13;
  // float *%12;
  // float **%11;
  // *%11 = %2;
  // %12 = *%11;
  // %13 = *%12;
  //
  // which ultimately, should correspond to:
  //
  // %13 = *%2;
  //
  // During rewriting, the pointer %12 is found to be replaceable by %2 (i.e.,
  // load_replacement_[12] is 2). However, when processing the load
  // %13 = *%12, the type of %12's reaching definition is another float
  // pointer (%2), instead of a float value.
  //
  // When this happens, we need to continue looking up the reaching definition
  // chain until we get to a float value or a non-target var (i.e. a variable
  // that cannot be SSA replaced, like %2 in this case since it is a function
  // argument).
  analysis::DefUseManager* def_use_mgr = pass_->context()->get_def_use_mgr();
  analysis::TypeManager* type_mgr = pass_->context()->get_type_mgr();
  analysis::Type* load_type = type_mgr->GetType(inst->type_id());
  uint32_t val_id = 0;
  bool found_reaching_def = false;
  while (!found_reaching_def) {
    if (!pass_->IsTargetVar(var_id)) {
      // If the variable we are loading from is not an SSA target (globals,
      // function parameters), do nothing.
      return true;
    }

    val_id = GetReachingDef(var_id, bb);
    if (val_id == 0) {
      return false;
    }

    // If the reaching definition is a pointer type different than the type of
    // the instruction we are analyzing, then it must be a reference to another
    // pointer (otherwise, this would be invalid SPIRV).  We continue
    // de-referencing it by making |val_id| be |var_id|.
    //
    // NOTE: if there is no reaching definition instruction, it means |val_id|
    // is an undef.
    Instruction* reaching_def_inst = def_use_mgr->GetDef(val_id);
    if (reaching_def_inst &&
        !type_mgr->GetType(reaching_def_inst->type_id())->IsSame(load_type)) {
      var_id = val_id;
    } else {
      found_reaching_def = true;
    }
  }

  // Schedule a replacement for the result of this load instruction with
  // |val_id|. After all the rewriting decisions are made, every use of
  // this load will be replaced with |val_id|.
  uint32_t load_id = inst->result_id();
  assert(load_replacement_.count(load_id) == 0);
  load_replacement_[load_id] = val_id;
  PhiCandidate* defining_phi = GetPhiCandidate(val_id);
  if (defining_phi) {
    defining_phi->AddUser(load_id);
  }

#if SSA_REWRITE_DEBUGGING_LEVEL > 1
  std::cerr << "\tFound load: "
            << inst->PrettyPrint(SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES)
            << " (replacement for %" << load_id << " is %" << val_id << ")\n";
#endif

  return true;
}